

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O2

bool __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
CharacterEscape<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
          (GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
          *ds,uint *escapedCodepoint)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  
  uVar1 = DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
          ::Take(ds);
  uVar3 = uVar1 - 0x28;
  if (uVar3 < 0x3f) {
    if ((0x7800000080004fU >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      if ((ulong)uVar3 != 0x3e) goto LAB_0011f65a;
      uVar1 = 0xc;
    }
  }
  else {
LAB_0011f65a:
    bVar2 = false;
    switch(uVar1) {
    case 0x6e:
      uVar1 = 10;
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
    case 0x77:
    case 0x78:
    case 0x79:
    case 0x7a:
      goto switchD_0011f672_caseD_6f;
    case 0x72:
      uVar1 = 0xd;
      break;
    case 0x74:
      uVar1 = 9;
      break;
    case 0x76:
      uVar1 = 0xb;
      break;
    case 0x7b:
    case 0x7c:
    case 0x7d:
      break;
    default:
      if (uVar1 != 0x24) {
        return false;
      }
    }
  }
  *escapedCodepoint = uVar1;
  bVar2 = true;
switchD_0011f672_caseD_6f:
  return bVar2;
}

Assistant:

bool CharacterEscape(DecodedStream<InputStream, Encoding>& ds, unsigned* escapedCodepoint) {
        unsigned codepoint;
        switch (codepoint = ds.Take()) {
            case '^':
            case '$':
            case '|':
            case '(':
            case ')':
            case '?':
            case '*':
            case '+':
            case '.':
            case '[':
            case ']':
            case '{':
            case '}':
            case '\\':
                *escapedCodepoint = codepoint; return true;
            case 'f': *escapedCodepoint = 0x000C; return true;
            case 'n': *escapedCodepoint = 0x000A; return true;
            case 'r': *escapedCodepoint = 0x000D; return true;
            case 't': *escapedCodepoint = 0x0009; return true;
            case 'v': *escapedCodepoint = 0x000B; return true;
            default:
                return false; // Unsupported escape character
        }
    }